

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O3

Clause * __thiscall value_precede::ex_t(value_precede *this,int ti)

{
  IntVar *pIVar1;
  Clause *pCVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  Clause *c;
  Clause *local_30;
  
  local_30 = (Clause *)malloc((long)ti * 4 + 0xc);
  *(uint *)local_30 = ti * 0x100 + 0x102;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_30);
  pCVar2 = local_30;
  if (0 < ti) {
    uVar4 = 1;
    do {
      pIVar1 = (this->xs).data[uVar4 - 1];
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                        (pIVar1,(long)*(int *)&(this->super_Propagator).field_0x14,1);
      if (*(uint *)pCVar2 >> 8 <= uVar4) {
        abort();
      }
      pCVar2->data[uVar4].x = iVar3;
      bVar5 = uVar4 != (uint)ti;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  return pCVar2;
}

Assistant:

Clause* ex_t(int ti) {
		Clause* r(Reason_new(ti + 1));
		int jj = 1;
		for (int ii = 0; ii < ti; ++ii, ++jj) {
			assert(!xs[ii]->indomain(s));
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		return r;
	}